

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::CodeHolder::resolveUnresolvedLinks(CodeHolder *this)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Section *pSVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  Section **ppSVar11;
  long *plVar12;
  Error local_5c;
  LabelLinkIterator link;
  ulong uVar6;
  
  if (this->_unresolvedLinkCount == 0) {
    local_5c = 0;
  }
  else {
    plVar12 = *(long **)&this->_labelEntries;
    plVar1 = plVar12 + *(uint *)&this->field_0x100;
    local_5c = 0;
    for (; plVar12 != plVar1; plVar12 = plVar12 + 1) {
      lVar3 = *plVar12;
      if (*(long *)(lVar3 + 0x20) != 0) {
        link._pPrev = (LabelLink **)(lVar3 + 0x28);
        link._link = *(LabelLink **)(lVar3 + 0x28);
        if (link._link != (LabelLink *)0x0) {
          uVar4 = *(ulong *)(*(long *)(lVar3 + 0x20) + 0x10);
          uVar5 = *(ulong *)(lVar3 + 0x18);
          uVar6 = *(ulong *)(lVar3 + 0x18);
          do {
            if ((link._link)->relocId == 0xffffffff) {
              uVar2 = (link._link)->sectionId;
              ppSVar11 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                                   (&this->_sections,(ulong)uVar2);
              pSVar7 = *ppSVar11;
              uVar8 = (link._link)->offset;
              ppSVar11 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                                   (&this->_sections,(ulong)uVar2);
              uVar9 = ((*ppSVar11)->_buffer)._size;
              if (uVar9 <= uVar8) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                           ,0x29a,"linkOffset < buf.size()");
              }
              if (CARRY8(pSVar7->_offset,uVar8) || CARRY8(uVar4,uVar5)) {
LAB_00111c89:
                local_5c = 0x30;
                goto LAB_00111c90;
              }
              if (uVar9 - uVar8 < (ulong)((link._link)->format)._valueSize) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                           ,0x2a3,"buf.size() - size_t(linkOffset) >= link->format.valueSize()");
              }
              bVar10 = CodeWriterUtils::writeOffset
                                 (((*ppSVar11)->_buffer)._data + uVar8,
                                  ((uVar4 + uVar6) - (pSVar7->_offset + uVar8)) + (link._link)->rel,
                                  &(link._link)->format);
              if (!bVar10) goto LAB_00111c89;
              LabelLinkIterator::resolveAndNext(&link,this);
            }
            else {
LAB_00111c90:
              link._pPrev = &(link._link)->next;
              link._link = (link._link)->next;
            }
          } while (link._link != (LabelLink *)0x0);
        }
      }
    }
  }
  return local_5c;
}

Assistant:

ASMJIT_API Error CodeHolder::resolveUnresolvedLinks() noexcept {
  if (!hasUnresolvedLinks())
    return kErrorOk;

  Error err = kErrorOk;
  for (LabelEntry* le : labelEntries()) {
    if (!le->isBound())
      continue;

    LabelLinkIterator link(le);
    if (link) {
      Support::FastUInt8 of = 0;
      Section* toSection = le->section();
      uint64_t toOffset = Support::addOverflow(toSection->offset(), le->offset(), &of);

      do {
        uint32_t linkSectionId = link->sectionId;
        if (link->relocId == Globals::kInvalidId) {
          Section* fromSection = sectionById(linkSectionId);
          size_t linkOffset = link->offset;

          CodeBuffer& buf = _sections[linkSectionId]->buffer();
          ASMJIT_ASSERT(linkOffset < buf.size());

          // Calculate the offset relative to the start of the virtual base.
          Support::FastUInt8 localOF = of;
          uint64_t fromOffset = Support::addOverflow<uint64_t>(fromSection->offset(), linkOffset, &localOF);
          int64_t displacement = int64_t(toOffset - fromOffset + uint64_t(int64_t(link->rel)));

          if (!localOF) {
            ASMJIT_ASSERT(size_t(linkOffset) < buf.size());
            ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.valueSize());

            // Overwrite a real displacement in the CodeBuffer.
            if (CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
              link.resolveAndNext(this);
              continue;
            }
          }

          err = DebugUtils::errored(kErrorInvalidDisplacement);
          // Falls through to `link.next()`.
        }

        link.next();
      } while (link);
    }
  }

  return err;
}